

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O1

void __thiscall OStream_LargeSpan_Test::TestBody(OStream_LargeSpan_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  InSequence seq;
  array<const_char,_7UL> v;
  test_ostream str;
  InSequence local_1b1;
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  local_1b0;
  MatcherBase<unsigned_long> local_190;
  undefined2 *local_178;
  undefined8 local_170;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined4 uStack_164;
  MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> local_158;
  undefined4 local_140;
  undefined3 uStack_13c;
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> local_138;
  first_elements_are local_100;
  first_elements_are local_e0;
  first_elements_are local_c0;
  test_ostream local_a0;
  
  uStack_13c = 0x676665;
  local_140 = 0x64636261;
  anon_unknown.dwarf_16a7a6::test_ostream::test_ostream(&local_a0);
  testing::InSequence::InSequence(&local_1b1);
  local_168 = 0x6261;
  uStack_166 = 99;
  local_170 = 3;
  paVar2 = &local_c0.expected_.field_2;
  local_178 = &local_168;
  local_c0.expected_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,&local_168,(long)&uStack_166 + 1);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_1b0,&local_c0);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (PolymorphicMatcher *)&local_1b0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,3);
  anon_unknown.dwarf_16a7a6::test_ostream::gmock_flush_buffer
            (&local_138,&local_a0,
             (Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xae,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"abc\"s}), test_ostream::buffer_size)"
                    );
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            ((MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> *)
             &local_138.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
              .
              super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>
            );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_138.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_158);
  paVar1 = &local_1b0.impl_.predicate_.expected_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.impl_.predicate_.expected_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0.impl_.predicate_.expected_._M_dataplus._M_p,
                    local_1b0.impl_.predicate_.expected_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.expected_._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.expected_._M_dataplus._M_p,
                    local_c0.expected_.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT44(uStack_164,CONCAT22(uStack_166,local_168)) + 1);
  }
  local_168 = 0x6564;
  uStack_166 = 0x66;
  local_170 = 3;
  paVar2 = &local_e0.expected_.field_2;
  local_178 = &local_168;
  local_e0.expected_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,&local_168);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_1b0,&local_e0);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (PolymorphicMatcher *)&local_1b0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,3);
  anon_unknown.dwarf_16a7a6::test_ostream::gmock_flush_buffer
            (&local_138,&local_a0,
             (Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xb0,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"def\"s}), test_ostream::buffer_size)"
                    );
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            ((MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> *)
             &local_138.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
              .
              super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>
            );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_138.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.impl_.predicate_.expected_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0.impl_.predicate_.expected_._M_dataplus._M_p,
                    local_1b0.impl_.predicate_.expected_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.expected_._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0.expected_._M_dataplus._M_p,
                    local_e0.expected_.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT44(uStack_164,CONCAT22(uStack_166,local_168)) + 1);
  }
  local_168 = 0x67;
  local_170 = 1;
  paVar2 = &local_100.expected_.field_2;
  local_178 = &local_168;
  local_100.expected_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_100,&local_168);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_1b0,&local_100);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (PolymorphicMatcher *)&local_1b0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,1);
  anon_unknown.dwarf_16a7a6::test_ostream::gmock_flush_buffer
            (&local_138,&local_a0,
             (Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xb1,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"g\"s}), std::size_t{1})");
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            ((MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> *)
             &local_138.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
              .
              super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>
            );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_138.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.impl_.predicate_.expected_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0.impl_.predicate_.expected_._M_dataplus._M_p,
                    local_1b0.impl_.predicate_.expected_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.expected_._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.expected_._M_dataplus._M_p,
                    local_100.expected_.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT44(uStack_164,CONCAT22(uStack_166,local_168)) + 1);
  }
  pstore::exchange::export_ns::ostream_base::write<7l>
            (&local_a0.super_ostream_base,(span<const_char,_7L>)&local_140);
  pstore::exchange::export_ns::ostream_base::flush(&local_a0.super_ostream_base);
  testing::InSequence::~InSequence(&local_1b1);
  local_a0.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__test_ostream_0023cb00;
  testing::internal::
  FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  ~FunctionMocker(&local_a0.gmock02_flush_buffer_96);
  pstore::exchange::export_ns::ostream_base::~ostream_base(&local_a0.super_ostream_base);
  return;
}

Assistant:

TEST (OStream, LargeSpan) {
    std::array<char const, 7U> const v{{'a', 'b', 'c', 'd', 'e', 'f', 'g'}};

    test_ostream str;

    // TODO: here the code could optimize the case where more than a buffer's worth of data is
    // being written.
    testing::InSequence seq;
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"abc"s}), test_ostream::buffer_size));
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"def"s}), test_ostream::buffer_size));
    EXPECT_CALL (str, flush_buffer (testing::Truly (first_elements_are{"g"s}), std::size_t{1}));

    str.write (pstore::gsl::make_span (v));
    str.flush ();
}